

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O0

Status __thiscall leveldb::TestWritableFile::Append(TestWritableFile *this,Slice *data)

{
  bool bVar1;
  size_t sVar2;
  Slice *in_RDX;
  Slice *data_local;
  TestWritableFile *this_local;
  Status *s;
  
  (**(code **)(*(long *)data[4].data_ + 0x10))(this,data[4].data_,in_RDX);
  bVar1 = Status::ok((Status *)this);
  if ((bVar1) &&
     (bVar1 = FaultInjectionTestEnv::IsFilesystemActive((FaultInjectionTestEnv *)data[5].data_),
     bVar1)) {
    sVar2 = Slice::size(in_RDX);
    data[2].size_ = sVar2 + data[2].size_;
  }
  return (Status)(char *)this;
}

Assistant:

Status TestWritableFile::Append(const Slice& data) {
  Status s = target_->Append(data);
  if (s.ok() && env_->IsFilesystemActive()) {
    state_.pos_ += data.size();
  }
  return s;
}